

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

type_id * metacall_type_ids(void **args,size_t size)

{
  metacall_value_id mVar1;
  type_id *ptVar2;
  size_t iterator;
  size_t sVar3;
  
  if (size == 0) {
    ptVar2 = (type_id *)0x0;
  }
  else {
    ptVar2 = (type_id *)malloc(size * 4);
    sVar3 = 0;
    do {
      mVar1 = metacall_value_id(args[sVar3]);
      ptVar2[sVar3] = mVar1;
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
  }
  return ptVar2;
}

Assistant:

type_id *metacall_type_ids(void *args[], size_t size)
{
	type_id *ids = NULL;

	if (size > 0)
	{
		ids = (type_id *)malloc(sizeof(type_id) * size);

		for (size_t iterator = 0; iterator < size; ++iterator)
		{
			ids[iterator] = metacall_value_id(args[iterator]);
		}
	}

	return ids;
}